

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

void mi_segment_span_free
               (mi_segment_t *segment,size_t slice_index,size_t slice_count,_Bool allow_purge,
               mi_segments_tld_t *tld)

{
  _Bool _Var1;
  mi_slice_t *sq_00;
  mi_slice_t *slice_00;
  mi_slice_t *pmVar2;
  byte in_CL;
  ulong in_RDX;
  long in_RSI;
  mi_segment_t *in_RDI;
  mi_slice_t *end;
  mi_slice_t *last;
  mi_slice_t *slice;
  mi_span_queue_t *sq;
  size_t in_stack_00000060;
  uint8_t *in_stack_00000068;
  mi_segment_t *in_stack_00000070;
  mi_slice_t *slice_01;
  mi_segments_tld_t *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  mi_slice_t *pmVar3;
  ulong local_18;
  
  if (in_RDI->kind != MI_SEGMENT_HUGE) {
    _Var1 = mi_segment_is_abandoned(in_RDI);
    if (!_Var1) {
      sq_00 = (mi_slice_t *)mi_span_queue_for(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      goto LAB_00c5c91b;
    }
  }
  sq_00 = (mi_slice_t *)0x0;
LAB_00c5c91b:
  local_18 = in_RDX;
  if (in_RDX == 0) {
    local_18 = 1;
  }
  slice_00 = in_RDI->slices + in_RSI;
  slice_00->slice_count = (uint32_t)local_18;
  slice_00->slice_offset = 0;
  slice_01 = sq_00;
  if (1 < local_18) {
    pmVar3 = slice_00 + (local_18 - 1);
    pmVar2 = mi_segment_slices_end(in_RDI);
    if (pmVar2 < pmVar3) {
      pmVar3 = pmVar2;
    }
    pmVar3->slice_count = 0;
    pmVar3->slice_offset = ((uint32_t)local_18 - 1) * 0x60;
    pmVar3->block_size = 0;
  }
  if ((in_CL & 1) != 0) {
    mi_slice_start(slice_01);
    mi_segment_schedule_purge(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  }
  if (sq_00 == (mi_slice_t *)0x0) {
    slice_00->block_size = 0;
  }
  else {
    mi_span_queue_push((mi_span_queue_t *)sq_00,slice_00);
  }
  return;
}

Assistant:

static void mi_segment_span_free(mi_segment_t* segment, size_t slice_index, size_t slice_count, bool allow_purge, mi_segments_tld_t* tld) {
  mi_assert_internal(slice_index < segment->slice_entries);
  mi_span_queue_t* sq = (segment->kind == MI_SEGMENT_HUGE || mi_segment_is_abandoned(segment)
                          ? NULL : mi_span_queue_for(slice_count,tld));
  if (slice_count==0) slice_count = 1;
  mi_assert_internal(slice_index + slice_count - 1 < segment->slice_entries);

  // set first and last slice (the intermediates can be undetermined)
  mi_slice_t* slice = &segment->slices[slice_index];
  slice->slice_count = (uint32_t)slice_count;
  mi_assert_internal(slice->slice_count == slice_count); // no overflow?
  slice->slice_offset = 0;
  if (slice_count > 1) {
    mi_slice_t* last = slice + slice_count - 1;
    mi_slice_t* end  = (mi_slice_t*)mi_segment_slices_end(segment);
    if (last > end) { last = end; }
    last->slice_count = 0;
    last->slice_offset = (uint32_t)(sizeof(mi_page_t)*(slice_count - 1));
    last->block_size = 0;
  }

  // perhaps decommit
  if (allow_purge) {
    mi_segment_schedule_purge(segment, mi_slice_start(slice), slice_count * MI_SEGMENT_SLICE_SIZE);
  }

  // and push it on the free page queue (if it was not a huge page)
  if (sq != NULL) mi_span_queue_push( sq, slice );
             else slice->block_size = 0; // mark huge page as free anyways
}